

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O2

Expression * wasm::Bits::makeSignExt(Expression *value,Index bytes,Module *wasm)

{
  uintptr_t uVar1;
  BinaryOp op;
  Expression *pEVar2;
  Binary *left;
  char *__assertion;
  int x;
  uint uVar3;
  Builder local_38;
  Builder builder;
  
  uVar1 = (value->type).id;
  local_38.wasm = wasm;
  if (uVar1 == 3) {
    switch(bytes) {
    case 1:
      uVar3 = 0x38;
      break;
    case 2:
    case 4:
      uVar3 = (uint)(bytes == 2) << 4 | 0x20;
      break;
    default:
      __assertion = "bytes == 8";
      uVar3 = 0x69;
      goto LAB_00961812;
    case 8:
      goto switchD_00961761_caseD_8;
    }
    pEVar2 = LiteralUtils::makeFromInt32(uVar3,(Type)0x3,wasm);
    left = Builder::makeBinary(&local_38,ShlInt64,value,pEVar2);
    pEVar2 = LiteralUtils::makeFromInt32(uVar3,(Type)0x3,wasm);
    op = ShrSInt64;
  }
  else {
    if (uVar1 != 2) {
      __assertion = "value->type == Type::i64";
      uVar3 = 0x5d;
LAB_00961812:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                    ,uVar3,"Expression *wasm::Bits::makeSignExt(Expression *, Index, Module &)");
    }
    if (1 < bytes - 1) {
      if (bytes == 4) {
        return value;
      }
      __assertion = "bytes == 4";
      uVar3 = 0x5a;
      goto LAB_00961812;
    }
    x = (uint)(bytes == 1) * 8 + 0x10;
    pEVar2 = LiteralUtils::makeFromInt32(x,(Type)0x2,wasm);
    left = Builder::makeBinary(&local_38,ShlInt32,value,pEVar2);
    pEVar2 = LiteralUtils::makeFromInt32(x,(Type)0x2,wasm);
    op = ShrSInt32;
  }
  value = (Expression *)Builder::makeBinary(&local_38,op,(Expression *)left,pEVar2);
switchD_00961761_caseD_8:
  return (Expression *)(Binary *)value;
}

Assistant:

inline Expression* makeSignExt(Expression* value, Index bytes, Module& wasm) {
  if (value->type == Type::i32) {
    if (bytes == 1 || bytes == 2) {
      auto shifts = bytes == 1 ? 24 : 16;
      Builder builder(wasm);
      return builder.makeBinary(
        ShrSInt32,
        builder.makeBinary(
          ShlInt32,
          value,
          LiteralUtils::makeFromInt32(shifts, Type::i32, wasm)),
        LiteralUtils::makeFromInt32(shifts, Type::i32, wasm));
    }
    assert(bytes == 4);
    return value; // nothing to do
  } else {
    assert(value->type == Type::i64);
    if (bytes == 1 || bytes == 2 || bytes == 4) {
      auto shifts = bytes == 1 ? 56 : (bytes == 2 ? 48 : 32);
      Builder builder(wasm);
      return builder.makeBinary(
        ShrSInt64,
        builder.makeBinary(
          ShlInt64,
          value,
          LiteralUtils::makeFromInt32(shifts, Type::i64, wasm)),
        LiteralUtils::makeFromInt32(shifts, Type::i64, wasm));
    }
    assert(bytes == 8);
    return value; // nothing to do
  }
}